

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

t_int * tabread4_tilde_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  void *__s;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  
  lVar5 = w[1];
  __s = (void *)w[3];
  lVar6 = *(long *)(lVar5 + 0x38);
  iVar7 = (int)w[4];
  if (*(int *)(lVar5 + 0x30) < 3 || lVar6 == 0) {
    if (iVar7 != 0) {
      memset(__s,0,(w[4] & 0xffffffffU) << 2);
    }
  }
  else if (0 < iVar7) {
    fVar1 = *(float *)(lVar5 + 0x4c);
    uVar8 = *(int *)(lVar5 + 0x30) - 3;
    lVar5 = w[2];
    lVar9 = 0;
    do {
      fVar2 = *(float *)(lVar5 + lVar9 * 4) + fVar1;
      uVar10 = (uint)fVar2;
      if ((int)uVar10 < 1) {
        fVar13 = 0.0;
        uVar12 = 1;
      }
      else {
        fVar13 = 1.0;
        uVar12 = uVar8;
        if ((int)uVar10 <= (int)uVar8) {
          fVar13 = fVar2 - (float)(int)uVar10;
          uVar12 = uVar10;
        }
      }
      uVar11 = (ulong)uVar12;
      fVar2 = *(float *)(lVar6 + -8 + uVar11 * 8);
      fVar3 = *(float *)(lVar6 + uVar11 * 8);
      fVar4 = *(float *)(lVar6 + 0x10 + uVar11 * 8);
      fVar14 = *(float *)(lVar6 + 8 + uVar11 * 8) - fVar3;
      *(float *)((long)__s + lVar9 * 4) =
           ((1.0 - fVar13) * -0.1666667 *
            ((fVar14 * -3.0 + (fVar4 - fVar2)) * fVar13 + fVar3 * -3.0 + fVar2 + fVar2 + fVar4) +
           fVar14) * fVar13 + fVar3;
      lVar9 = lVar9 + 1;
    } while (iVar7 != (int)lVar9);
  }
  return w + 5;
}

Assistant:

static t_int *tabread4_tilde_perform(t_int *w)
{
    t_tabread4_tilde *x = (t_tabread4_tilde *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    int maxindex;
    t_word *buf = x->x_vec, *wp;
    double onset = x->x_onset;
    int i;

    maxindex = x->x_npoints - 3;
    if(maxindex<0) goto zero;

    if (!buf) goto zero;

#if 0       /* test for spam -- I'm not ready to deal with this */
    for (i = 0,  xmax = 0, xmin = maxindex,  fp = in1; i < n; i++,  fp++)
    {
        t_sample f = *in1;
        if (f < xmin) xmin = f;
        else if (f > xmax) xmax = f;
    }
    if (xmax < xmin + x->c_maxextent) xmax = xmin + x->c_maxextent;
    for (i = 0, splitlo = xmin+ x->c_maxextent, splithi = xmax - x->c_maxextent,
        fp = in1; i < n; i++,  fp++)
    {
        t_sample f = *in1;
        if (f > splitlo && f < splithi) goto zero;
    }
#endif

    for (i = 0; i < n; i++)
    {
        double findex = *in++ + onset;
        int index = findex;
        t_sample frac,  a,  b,  c,  d, cminusb;
        if (index < 1)
            index = 1, frac = 0;
        else if (index > maxindex)
            index = maxindex, frac = 1;
        else frac = findex - index;
        wp = buf + index;
        a = wp[-1].w_float;
        b = wp[0].w_float;
        c = wp[1].w_float;
        d = wp[2].w_float;
        cminusb = c-b;
        *out++ = b + frac * (
            cminusb - 0.1666667f * (1.-frac) * (
                (d - a - 3.0f * cminusb) * frac + (d + 2.0f*a - 3.0f*b)
            )
        );
    }
    return (w+5);
 zero:
    while (n--) *out++ = 0;

    return (w+5);
}